

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  _Bool _Var1;
  int local_38;
  int iStack_34;
  _Bool areequal;
  int i_1;
  int i;
  roaring_array_t *ra2;
  roaring_array_t *ra1;
  roaring_bitmap_t *r2_local;
  roaring_bitmap_t *r1_local;
  
  if ((r1->high_low_container).size == (r2->high_low_container).size) {
    for (iStack_34 = 0; iStack_34 < (r1->high_low_container).size; iStack_34 = iStack_34 + 1) {
      if ((r1->high_low_container).keys[iStack_34] != (r2->high_low_container).keys[iStack_34]) {
        return false;
      }
    }
    for (local_38 = 0; local_38 < (r1->high_low_container).size; local_38 = local_38 + 1) {
      _Var1 = container_equals((r1->high_low_container).containers[local_38],
                               (r1->high_low_container).typecodes[local_38],
                               (r2->high_low_container).containers[local_38],
                               (r2->high_low_container).typecodes[local_38]);
      if (!_Var1) {
        return false;
      }
    }
    r1_local._7_1_ = true;
  }
  else {
    r1_local._7_1_ = false;
  }
  return r1_local._7_1_;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i],
                                         ra1->typecodes[i],
                                         ra2->containers[i],
                                         ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}